

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3333::ComputeInternalJacobianPreInt
          (ChElementBeamANCF_3333 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  Matrix<double,__1,__1,_0,__1,__1> *a_rhs;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  PointerType pdVar9;
  ulong uVar10;
  char *__function;
  int iVar11;
  PointerType pdVar12;
  double *pdVar13;
  long lVar14;
  PointerType pdVar15;
  ulong uVar16;
  ulong uVar17;
  double *pdVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  uint v;
  uint uVar22;
  long lVar23;
  variable_if_dynamic<long,__1> *a_lhs;
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined8 in_XMM0_Qb;
  undefined1 auVar41 [16];
  undefined8 in_XMM1_Qb;
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  ChVectorN<double,_(NSF_*_(NSF___1))___2>_conflict1 ScaledMassMatrix;
  MatrixNxN K_K13Compact;
  ChMatrixNM<double,_1,_NSF>_conflict1 tempRow2;
  ChMatrixNM<double,_1,_NSF>_conflict1 tempRow1;
  ChMatrixNM<double,_1,_NSF>_conflict1 tempRow0;
  Matrix3xN e_bar;
  Matrix3xN e_bar_dot;
  ChMatrixNMc<double,_9,_NSF_*_NSF> K2;
  ChMatrixNMc<double,_9,_NSF_*_NSF> PI2;
  Scalar local_3458;
  double dStack_3450;
  double local_3448;
  double dStack_3440;
  double local_3438;
  double dStack_3430;
  double local_3428;
  double dStack_3420;
  double local_3418;
  double dStack_3410;
  double local_3408;
  double dStack_3400;
  double local_33f8;
  double dStack_33f0;
  double local_33e8;
  double dStack_33e0;
  double local_33d8;
  double dStack_33d0;
  double local_33c8;
  double dStack_33c0;
  double local_33b8;
  double dStack_33b0;
  double local_33a8;
  double dStack_33a0;
  double local_3398;
  double dStack_3390;
  double local_3388;
  double dStack_3380;
  double local_3378;
  double dStack_3370;
  double local_3368;
  double dStack_3360;
  double local_3358;
  double dStack_3350;
  double local_3348;
  double dStack_3340;
  double local_3338;
  double dStack_3330;
  double local_3328;
  double dStack_3320;
  double local_3318;
  double dStack_3310;
  double local_3308;
  double dStack_3300;
  double local_32f8;
  Block<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false> local_32f0 [13];
  Matrix<double,_1,_9,_1,_1,_9> local_3068;
  Matrix<double,_1,_9,_1,_1,_9> local_3018;
  Matrix<double,_1,_9,_1,_1,_9> local_2fc8;
  Matrix<double,_3,_9,_1,_3,_9> local_2f78;
  Matrix3xN local_2e98;
  Matrix<double,_9,_81,_0,_9,_81> local_2dc0;
  Matrix<double,_9,_81,_0,_9,_81> local_16f8;
  
  pdVar18 = (double *)&local_2f78;
  CalcCoordMatrix(this,(Matrix3xN *)pdVar18);
  CalcCoordDerivMatrix(this,&local_2e98);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = this->m_Alpha;
  auVar8._8_8_ = in_XMM1_Qb;
  auVar8._0_8_ = Rfactor;
  auVar24._8_8_ = in_XMM0_Qb;
  auVar24._0_8_ = Kfactor;
  pdVar13 = (double *)&local_16f8;
  lVar21 = 0;
  auVar24 = vfmadd213sd_fma(auVar8,auVar41,auVar24);
  dVar5 = this->m_Alpha * Kfactor;
  dVar42 = auVar24._0_8_;
  local_2fc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0]
       = dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0] +
         dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                 m_data.array[0];
  local_2fc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[1]
       = dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[1] +
         dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                 m_data.array[1];
  local_2fc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[2]
       = dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[2] +
         dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                 m_data.array[2];
  local_2fc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[3]
       = dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[3] +
         dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                 m_data.array[3];
  local_2fc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[4]
       = dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[4] +
         dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                 m_data.array[4];
  local_2fc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[5]
       = dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[5] +
         dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                 m_data.array[5];
  local_2fc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[6]
       = dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[6] +
         dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                 m_data.array[6];
  local_2fc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[7]
       = dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[7] +
         dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                 m_data.array[7];
  auVar43._0_8_ =
       dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
               m_data.array[8] +
       dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                m_data.array[8];
  auVar43._8_8_ =
       dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
               m_data.array[9] +
       dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                m_data.array[9];
  local_2fc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[8]
       = (double)vmovlpd_avx(auVar43);
  local_3018.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[1]
       = dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[10] +
         dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                 m_data.array[10];
  local_3018.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[2]
       = dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0xb] +
         dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                 m_data.array[0xb];
  local_3018.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[3]
       = dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0xc] +
         dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                 m_data.array[0xc];
  local_3018.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[4]
       = dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0xd] +
         dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                 m_data.array[0xd];
  local_3018.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[5]
       = dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0xe] +
         dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                 m_data.array[0xe];
  local_3018.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[6]
       = dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0xf] +
         dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                 m_data.array[0xf];
  auVar44._0_8_ =
       dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                m_data.array[0x10] +
       dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
               m_data.array[0x10];
  auVar44._8_8_ =
       dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                m_data.array[0x11] +
       dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
               m_data.array[0x11];
  local_3068.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0]
       = dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x12] +
         dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                 m_data.array[0x12];
  local_3068.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[1]
       = dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x13] +
         dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                 m_data.array[0x13];
  local_3068.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[2]
       = dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x14] +
         dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                 m_data.array[0x14];
  local_3068.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[3]
       = dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x15] +
         dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                 m_data.array[0x15];
  local_3068.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[4]
       = dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x16] +
         dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                 m_data.array[0x16];
  local_3068.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[5]
       = dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x17] +
         dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                 m_data.array[0x17];
  local_3068.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[6]
       = dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x18] +
         dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                 m_data.array[0x18];
  local_3068.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[7]
       = dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x19] +
         dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                 m_data.array[0x19];
  lVar23 = 0;
  local_3018.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[8]
       = (double)vmovhpd_avx(auVar44);
  local_3068.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[8]
       = dVar42 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x1a] +
         dVar5 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                 m_data.array[0x1a];
  local_3018.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0]
       = auVar43._8_8_;
  local_3018.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[7]
       = auVar44._0_8_;
  do {
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [2] = (double)&local_2f78;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [6] = (double)&local_2fc8;
    local_32f0[0].super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_xpr =
         &local_16f8;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [3] = 0.0;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [5] = 4.94065645841247e-324;
    local_32f0[0].super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_startRow.
    m_value = 0;
    local_32f0[0].super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_outerStride
         = 9;
    local_32f0[0].super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false>,_0>.m_data =
         pdVar13;
    local_32f0[0].super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_startCol.
    m_value = lVar21;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [0] = (double)pdVar18;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [4] = (double)lVar23;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,9,81,0,9,81>,3,9,false>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,9,1,3,9>,3,1,false>,Eigen::Matrix<double,1,9,1,1,9>,0>,Eigen::internal::assign_op<double,double>>
              (local_32f0,
               (Product<Eigen::Block<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_3,_1,_false>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>
                *)&local_2dc0,(assign_op<double,_double> *)&local_3458,(type)0x0);
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [2] = (double)&local_2f78;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [6] = (double)&local_3018;
    local_32f0[0].super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false>,_0>.m_data =
         pdVar13 + 3;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [3] = 0.0;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [5] = 4.94065645841247e-324;
    local_32f0[0].super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_xpr =
         &local_16f8;
    local_32f0[0].super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_startRow.
    m_value = 3;
    local_32f0[0].super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_outerStride
         = 9;
    local_32f0[0].super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_startCol.
    m_value = lVar21;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [0] = (double)pdVar18;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [4] = (double)lVar23;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,9,81,0,9,81>,3,9,false>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,9,1,3,9>,3,1,false>,Eigen::Matrix<double,1,9,1,1,9>,0>,Eigen::internal::assign_op<double,double>>
              (local_32f0,
               (Product<Eigen::Block<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_3,_1,_false>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>
                *)&local_2dc0,(assign_op<double,_double> *)&local_3458,(type)0x0);
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [2] = (double)&local_2f78;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [6] = (double)&local_3068;
    local_32f0[0].super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false>,_0>.m_data =
         pdVar13 + 6;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [3] = 0.0;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [5] = 4.94065645841247e-324;
    local_32f0[0].super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_xpr =
         &local_16f8;
    local_32f0[0].super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_startRow.
    m_value = 6;
    local_32f0[0].super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_outerStride
         = 9;
    local_32f0[0].super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>
    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_startCol.
    m_value = lVar21;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [0] = (double)pdVar18;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [4] = (double)lVar23;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,9,81,0,9,81>,3,9,false>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,9,1,3,9>,3,1,false>,Eigen::Matrix<double,1,9,1,1,9>,0>,Eigen::internal::assign_op<double,double>>
              (local_32f0,
               (Product<Eigen::Block<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_3,_1,_false>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>
                *)&local_2dc0,(assign_op<double,_double> *)&local_3458,(type)0x0);
    lVar23 = lVar23 + 1;
    pdVar13 = pdVar13 + 0x51;
    pdVar18 = pdVar18 + 1;
    lVar21 = lVar21 + 9;
  } while (lVar23 != 9);
  local_32f0[0].super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false>,_0>.m_data =
       (PointerType)&local_16f8;
  a_rhs = &this->m_O2;
  local_32f0[0].super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_xpr =
       (XprTypeNested)a_rhs;
  if ((this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
      != 0x51) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, 9, 81, 0>>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, 9, 81, 0>>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
                 );
  }
  if ((this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
      == 0x51) {
    lVar14 = 0;
    memset(&local_2dc0,0,0x16c8);
    a_lhs = (variable_if_dynamic<long,__1> *)local_32f0;
    local_3458 = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,9,81,0,9,81>const>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,9,81,0,9,81>>
              (&local_2dc0,
               (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_9,_81,_0,_9,_81>_>
                *)a_lhs,a_rhs,&local_3458);
    lVar21 = (H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).m_stride.m_outer.m_value;
    pdVar9 = (H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_data;
    lVar23 = (H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_rows.m_value;
    pdVar18 = local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.
              m_data.array + 8;
    pdVar12 = pdVar9 + lVar21;
    pdVar15 = pdVar9 + lVar21 * 2;
    do {
      if (lVar23 < lVar14 * 3 + 3) {
LAB_007254dd:
        __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,
                      "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 3, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
                     );
      }
      lVar20 = 2;
      pdVar13 = pdVar18;
      do {
        if ((H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value <= lVar20 + -2) goto LAB_007254dd;
        pdVar9[lVar20 + -2] = ((plain_array<double,_729,_0,_0> *)(pdVar13 + -8))->array[0];
        pdVar12[lVar20 + -2] = pdVar13[-7];
        pdVar15[lVar20 + -2] = pdVar13[-6];
        if ((H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value <= lVar20 + -1) goto LAB_007254dd;
        pdVar9[lVar20 + -1] = pdVar13[-5];
        pdVar12[lVar20 + -1] = pdVar13[-4];
        pdVar15[lVar20 + -1] = pdVar13[-3];
        if ((H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value <= lVar20) goto LAB_007254dd;
        pdVar9[lVar20] = pdVar13[-2];
        pdVar12[lVar20] = pdVar13[-1];
        dVar5 = *pdVar13;
        pdVar13 = pdVar13 + 0x51;
        pdVar15[lVar20] = dVar5;
        lVar20 = lVar20 + 3;
      } while (lVar20 != 0x1d);
      lVar14 = lVar14 + 1;
      pdVar9 = pdVar9 + lVar21 * 3;
      pdVar12 = pdVar12 + lVar21 * 3;
      pdVar15 = pdVar15 + lVar21 * 3;
      pdVar18 = pdVar18 + 9;
    } while (lVar14 != 9);
    uVar10 = (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols;
    uVar19 = (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    if ((long)(uVar10 | uVar19) < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((uVar19 == 9) && (uVar10 == 9)) {
      auVar7._8_8_ = in_XMM0_Qb;
      auVar7._0_8_ = Kfactor;
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar26 = vpbroadcastq_avx512f(ZEXT816(9));
      auVar27 = vpbroadcastq_avx512f(ZEXT816(0x48));
      auVar28 = vpbroadcastq_avx512f(ZEXT816(8));
      pdVar18 = (this->m_K13Compact).
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
      lVar21 = -0x10;
      auVar29 = vpbroadcastq_avx512f();
      auVar6._8_8_ = 0x8000000000000000;
      auVar6._0_8_ = 0x8000000000000000;
      auVar24 = vxorpd_avx512vl(auVar7,auVar6);
      auVar30 = vbroadcastsd_avx512f(auVar24);
      do {
        uVar10 = vpcmpuq_avx512f(auVar25,auVar26,1);
        auVar31 = vpmullq_avx512dq(auVar25,auVar27);
        auVar25 = vpaddq_avx512f(auVar25,auVar28);
        pdVar13 = pdVar18 + lVar21 + 0x10;
        bVar4 = (byte)uVar10;
        auVar33._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * (long)pdVar13[1];
        auVar33._0_8_ = (ulong)(bVar4 & 1) * (long)*pdVar13;
        auVar33._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * (long)pdVar13[2];
        auVar33._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * (long)pdVar13[3];
        auVar33._32_8_ = (ulong)((byte)(uVar10 >> 4) & 1) * (long)pdVar13[4];
        auVar33._40_8_ = (ulong)((byte)(uVar10 >> 5) & 1) * (long)pdVar13[5];
        auVar33._48_8_ = (ulong)((byte)(uVar10 >> 6) & 1) * (long)pdVar13[6];
        auVar33._56_8_ = (uVar10 >> 7) * (long)pdVar13[7];
        auVar32 = vpaddq_avx512f(auVar29,auVar31);
        auVar33 = vmulpd_avx512f(auVar33,auVar30);
        vscatterqpd_avx512f(ZEXT864(a_lhs) + auVar31,uVar10,auVar33);
        pdVar13 = pdVar18 + lVar21 + 0x19;
        auVar31._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * (long)pdVar13[1];
        auVar31._0_8_ = (ulong)(bVar4 & 1) * (long)*pdVar13;
        auVar31._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * (long)pdVar13[2];
        auVar31._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * (long)pdVar13[3];
        auVar31._32_8_ = (ulong)((byte)(uVar10 >> 4) & 1) * (long)pdVar13[4];
        auVar31._40_8_ = (ulong)((byte)(uVar10 >> 5) & 1) * (long)pdVar13[5];
        auVar31._48_8_ = (ulong)((byte)(uVar10 >> 6) & 1) * (long)pdVar13[6];
        auVar31._56_8_ = (uVar10 >> 7) * (long)pdVar13[7];
        auVar31 = vmulpd_avx512f(auVar31,auVar30);
        vscatterqpd_avx512f(ZEXT864(8) + auVar32,uVar10,auVar31);
        pdVar13 = pdVar18 + lVar21 + 0x22;
        auVar34._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * (long)pdVar13[1];
        auVar34._0_8_ = (ulong)(bVar4 & 1) * (long)*pdVar13;
        auVar34._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * (long)pdVar13[2];
        auVar34._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * (long)pdVar13[3];
        auVar34._32_8_ = (ulong)((byte)(uVar10 >> 4) & 1) * (long)pdVar13[4];
        auVar34._40_8_ = (ulong)((byte)(uVar10 >> 5) & 1) * (long)pdVar13[5];
        auVar34._48_8_ = (ulong)((byte)(uVar10 >> 6) & 1) * (long)pdVar13[6];
        auVar34._56_8_ = (uVar10 >> 7) * (long)pdVar13[7];
        auVar31 = vmulpd_avx512f(auVar34,auVar30);
        vscatterqpd_avx512f(ZEXT864(0x10) + auVar32,uVar10,auVar31);
        pdVar13 = pdVar18 + lVar21 + 0x2b;
        auVar35._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * (long)pdVar13[1];
        auVar35._0_8_ = (ulong)(bVar4 & 1) * (long)*pdVar13;
        auVar35._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * (long)pdVar13[2];
        auVar35._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * (long)pdVar13[3];
        auVar35._32_8_ = (ulong)((byte)(uVar10 >> 4) & 1) * (long)pdVar13[4];
        auVar35._40_8_ = (ulong)((byte)(uVar10 >> 5) & 1) * (long)pdVar13[5];
        auVar35._48_8_ = (ulong)((byte)(uVar10 >> 6) & 1) * (long)pdVar13[6];
        auVar35._56_8_ = (uVar10 >> 7) * (long)pdVar13[7];
        auVar31 = vmulpd_avx512f(auVar35,auVar30);
        vscatterqpd_avx512f(ZEXT864(0x18) + auVar32,uVar10,auVar31);
        pdVar13 = pdVar18 + lVar21 + 0x34;
        auVar36._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * (long)pdVar13[1];
        auVar36._0_8_ = (ulong)(bVar4 & 1) * (long)*pdVar13;
        auVar36._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * (long)pdVar13[2];
        auVar36._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * (long)pdVar13[3];
        auVar36._32_8_ = (ulong)((byte)(uVar10 >> 4) & 1) * (long)pdVar13[4];
        auVar36._40_8_ = (ulong)((byte)(uVar10 >> 5) & 1) * (long)pdVar13[5];
        auVar36._48_8_ = (ulong)((byte)(uVar10 >> 6) & 1) * (long)pdVar13[6];
        auVar36._56_8_ = (uVar10 >> 7) * (long)pdVar13[7];
        auVar31 = vmulpd_avx512f(auVar36,auVar30);
        vscatterqpd_avx512f(ZEXT864(0x20) + auVar32,uVar10,auVar31);
        pdVar13 = pdVar18 + lVar21 + 0x3d;
        auVar37._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * (long)pdVar13[1];
        auVar37._0_8_ = (ulong)(bVar4 & 1) * (long)*pdVar13;
        auVar37._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * (long)pdVar13[2];
        auVar37._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * (long)pdVar13[3];
        auVar37._32_8_ = (ulong)((byte)(uVar10 >> 4) & 1) * (long)pdVar13[4];
        auVar37._40_8_ = (ulong)((byte)(uVar10 >> 5) & 1) * (long)pdVar13[5];
        auVar37._48_8_ = (ulong)((byte)(uVar10 >> 6) & 1) * (long)pdVar13[6];
        auVar37._56_8_ = (uVar10 >> 7) * (long)pdVar13[7];
        auVar31 = vmulpd_avx512f(auVar37,auVar30);
        vscatterqpd_avx512f(ZEXT864(0x28) + auVar32,uVar10,auVar31);
        pdVar13 = pdVar18 + lVar21 + 0x46;
        auVar38._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * (long)pdVar13[1];
        auVar38._0_8_ = (ulong)(bVar4 & 1) * (long)*pdVar13;
        auVar38._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * (long)pdVar13[2];
        auVar38._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * (long)pdVar13[3];
        auVar38._32_8_ = (ulong)((byte)(uVar10 >> 4) & 1) * (long)pdVar13[4];
        auVar38._40_8_ = (ulong)((byte)(uVar10 >> 5) & 1) * (long)pdVar13[5];
        auVar38._48_8_ = (ulong)((byte)(uVar10 >> 6) & 1) * (long)pdVar13[6];
        auVar38._56_8_ = (uVar10 >> 7) * (long)pdVar13[7];
        auVar31 = vmulpd_avx512f(auVar38,auVar30);
        vscatterqpd_avx512f(ZEXT864(0x30) + auVar32,uVar10,auVar31);
        pdVar13 = pdVar18 + lVar21 + 0x4f;
        auVar39._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * (long)pdVar13[1];
        auVar39._0_8_ = (ulong)(bVar4 & 1) * (long)*pdVar13;
        auVar39._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * (long)pdVar13[2];
        auVar39._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * (long)pdVar13[3];
        auVar39._32_8_ = (ulong)((byte)(uVar10 >> 4) & 1) * (long)pdVar13[4];
        auVar39._40_8_ = (ulong)((byte)(uVar10 >> 5) & 1) * (long)pdVar13[5];
        auVar39._48_8_ = (ulong)((byte)(uVar10 >> 6) & 1) * (long)pdVar13[6];
        auVar39._56_8_ = (uVar10 >> 7) * (long)pdVar13[7];
        auVar31 = vmulpd_avx512f(auVar39,auVar30);
        vscatterqpd_avx512f(ZEXT864(0x38) + auVar32,uVar10,auVar31);
        pdVar13 = pdVar18 + lVar21 + 0x58;
        auVar40._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * (long)pdVar13[1];
        auVar40._0_8_ = (ulong)(bVar4 & 1) * (long)*pdVar13;
        auVar40._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * (long)pdVar13[2];
        auVar40._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * (long)pdVar13[3];
        auVar40._32_8_ = (ulong)((byte)(uVar10 >> 4) & 1) * (long)pdVar13[4];
        auVar40._40_8_ = (ulong)((byte)(uVar10 >> 5) & 1) * (long)pdVar13[5];
        auVar40._48_8_ = (ulong)((byte)(uVar10 >> 6) & 1) * (long)pdVar13[6];
        auVar40._56_8_ = (uVar10 >> 7) * (long)pdVar13[7];
        lVar21 = lVar21 + 8;
        auVar31 = vmulpd_avx512f(auVar40,auVar30);
        vscatterqpd_avx512f(ZEXT864(0x40) + auVar32,uVar10,auVar31);
      } while (lVar21 != 0);
      lVar14 = 0x10;
      lVar20 = 8;
      lVar21 = -0xfffffff0;
      uVar10 = 0;
      lVar23 = 0;
      uVar19 = 0;
      local_3458 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0];
      dStack_3450 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[1];
      local_3448 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[2];
      dStack_3440 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[3];
      local_3438 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[4];
      dStack_3430 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[5];
      local_3428 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[6];
      dStack_3420 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[7];
      local_3418 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[8];
      dStack_3410 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[9];
      local_3408 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[10];
      dStack_3400 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0xb];
      local_33f8 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0xc];
      dStack_33f0 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0xd];
      local_33e8 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0xe];
      dStack_33e0 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0xf];
      local_33d8 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x10];
      dStack_33d0 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x11];
      local_33c8 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x12];
      dStack_33c0 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x13];
      local_33b8 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x14];
      dStack_33b0 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x15];
      local_33a8 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x16];
      dStack_33a0 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x17];
      local_3398 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x18];
      dStack_3390 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x19];
      local_3388 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x1a];
      dStack_3380 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x1b];
      local_3378 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x1c];
      dStack_3370 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x1d];
      local_3368 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x1e];
      dStack_3360 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x1f];
      local_3358 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x20];
      dStack_3350 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x21];
      local_3348 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x22];
      dStack_3340 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x23];
      local_3338 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x24];
      dStack_3330 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x25];
      local_3328 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x26];
      dStack_3320 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x27];
      local_3318 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x28];
      dStack_3310 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x29];
      local_3308 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x2a];
      dStack_3300 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x2b];
      local_32f8 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x2c];
      do {
        lVar1 = (H->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).m_stride.m_outer.m_value;
        pdVar12 = (H->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_data;
        uVar2 = (H->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_rows.m_value;
        uVar3 = (H->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_cols.m_value;
        uVar17 = 2;
        uVar16 = 0;
        iVar11 = 9;
        do {
          if (uVar16 < uVar19) {
            uVar22 = (((int)uVar16 + -8) * iVar11 + 0x48U >> 1) + (int)uVar19;
          }
          else {
            uVar22 = ((uint)(uVar10 >> 1) & 0x7fffffff) + (int)uVar16;
          }
          if (0x2c < uVar22) {
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 45, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, 45, 1>, Level = 1]"
                         );
          }
          if (((long)uVar2 <= (long)(uVar19 * 3)) || ((long)uVar3 <= (long)(uVar17 - 2))) {
LAB_007254fc:
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                         );
          }
          dVar5 = (&local_3458)[uVar22] + (double)a_lhs[uVar16].m_value;
          *(double *)((long)pdVar12 + uVar17 * 8 + lVar1 * lVar23 + -0x10) =
               dVar5 + *(double *)((long)pdVar12 + uVar17 * 8 + lVar1 * lVar23 + -0x10);
          if ((uVar2 <= uVar19 * 3 + 1) ||
             (((uVar3 <= uVar17 - 1 ||
               (*(double *)((long)pdVar12 + uVar17 * 8 + lVar1 * lVar20 + -8) =
                     dVar5 + *(double *)((long)pdVar12 + uVar17 * 8 + lVar1 * lVar20 + -8),
               uVar2 <= uVar19 * 3 + 2)) || (uVar3 <= uVar17)))) goto LAB_007254fc;
          uVar16 = uVar16 + 1;
          iVar11 = iVar11 + -1;
          *(double *)((long)pdVar12 + uVar17 * 8 + lVar1 * lVar14) =
               dVar5 + *(double *)((long)pdVar12 + uVar17 * 8 + lVar1 * lVar14);
          uVar17 = uVar17 + 3;
        } while (uVar17 != 0x1d);
        uVar19 = uVar19 + 1;
        a_lhs = a_lhs + 9;
        uVar10 = uVar10 + lVar21;
        lVar14 = lVar14 + 0x18;
        lVar20 = lVar20 + 0x18;
        lVar23 = lVar23 + 0x18;
        lVar21 = lVar21 + -2;
        if (uVar19 == 9) {
          return;
        }
      } while( true );
    }
    __function = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 9, 9, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 9, 9, 1>]"
    ;
  }
  else {
    __function = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 9, 81, 0>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 9, 81, 0>]"
    ;
  }
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,__function);
}

Assistant:

void ChElementBeamANCF_3333::ComputeInternalJacobianPreInt(ChMatrixRef& H,
                                                           double Kfactor,
                                                           double Rfactor,
                                                           double Mfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Pre-Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // components of the generalized internal force vector and its Jacobian that need to be integrated across the volume
    // are calculated once prior to the start of the simulation.  Since computationally expensive quantities are
    // required for both the generalized internal force vector and its Jacobian, these values were cached for reuse
    // during this Jacobian calculation.

    Matrix3xN e_bar;
    Matrix3xN e_bar_dot;

    CalcCoordMatrix(e_bar);
    CalcCoordDerivMatrix(e_bar_dot);

    // Build the [9 x NSF^2] matrix containing the combined scaled nodal coordinates and their time derivatives.
    Matrix3xN temp = (Kfactor + m_Alpha * Rfactor) * e_bar + (m_Alpha * Kfactor) * e_bar_dot;
    ChMatrixNM<double, 1, NSF> tempRow0 = temp.template block<1, NSF>(0, 0);
    ChMatrixNM<double, 1, NSF> tempRow1 = temp.template block<1, NSF>(1, 0);
    ChMatrixNM<double, 1, NSF> tempRow2 = temp.template block<1, NSF>(2, 0);
    ChMatrixNMc<double, 9, NSF * NSF> PI2;

    for (unsigned int v = 0; v < NSF; v++) {
        PI2.template block<3, NSF>(0, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow0;
        PI2.template block<3, NSF>(3, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow1;
        PI2.template block<3, NSF>(6, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow2;
    }

    // Calculate the matrix containing the dense part of the Jacobian matrix in a reordered form. This is then reordered
    // from its [9 x NSF^2] form into its required [3*NSF x 3*NSF] form
    ChMatrixNMc<double, 9, NSF* NSF> K2 = -PI2 * m_O2;

    for (unsigned int k = 0; k < NSF; k++) {
        for (unsigned int f = 0; f < NSF; f++) {
            H.block<3, 1>(3 * k, 3 * f) = K2.template block<3, 1>(0, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 1) = K2.template block<3, 1>(3, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 2) = K2.template block<3, 1>(6, NSF * f + k);
        }
    }

    // Add in the sparse (blocks times the 3x3 identity matrix) component of the Jacobian that was already calculated as
    // part of the generalized internal force calculations as well as the Mass Matrix which is stored in compact upper
    // triangular form
    MatrixNxN K_K13Compact = -Kfactor * m_K13Compact;
    ChVectorN<double, (NSF * (NSF + 1)) / 2> ScaledMassMatrix = Mfactor * m_MassMatrix;

    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = 0; j < NSF; j++) {
            unsigned int idx;
            // Convert from a (i,j) index to a linear index into the Mass Matrix in Compact Upper Triangular Form
            // https://math.stackexchange.com/questions/2134011/conversion-of-upper-triangle-linear-index-from-index-on-symmetrical-array
            if (j >= i) {
                idx = (NSF * (NSF - 1) - (NSF - i) * (NSF - i - 1)) / 2 + j;
            } else {
                idx = (NSF * (NSF - 1) - (NSF - j) * (NSF - j - 1)) / 2 + i;
            }

            double d = ScaledMassMatrix(idx) + K_K13Compact(i, j);
            H(3 * i, 3 * j) += d;
            H(3 * i + 1, 3 * j + 1) += d;
            H(3 * i + 2, 3 * j + 2) += d;
        }
    }
}